

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rMayHaveNull,int isRowid)

{
  u8 uVar1;
  byte bVar2;
  ExprList *pEVar3;
  _func_int_Walker_ptr_Expr_ptr *p_Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int p1;
  Vdbe *pVVar8;
  Vdbe *p;
  Expr *pEVar9;
  int p2;
  long lVar10;
  char *pcVar11;
  int iVar12;
  Select *pSVar13;
  ExprList_item *pEVar14;
  char affinity;
  int iValToIns;
  KeyInfo keyInfo;
  char local_a9;
  int local_a8;
  uint local_a4;
  int local_a0;
  int local_9c;
  Vdbe *local_98;
  int local_8c;
  Parse *local_88;
  Walker local_80;
  char local_58 [16];
  u8 *local_48;
  CollSeq *pCStack_40;
  
  local_9c = isRowid;
  pVVar8 = sqlite3GetVdbe(pParse);
  if (pVVar8 == (Vdbe *)0x0) {
    return 0;
  }
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  uVar5 = 0xffffffff;
  if ((pExpr->flags & 0x20) == 0) {
    p = sqlite3GetVdbe(pParse);
    iVar6 = pParse->nOnce;
    pParse->nOnce = iVar6 + 1;
    uVar5 = sqlite3VdbeAddOp3(p,0x1a,iVar6,0,0);
  }
  if (pParse->explain == '\x02') {
    pcVar11 = "CORRELATED ";
    if (-1 < (int)uVar5) {
      pcVar11 = "";
    }
    pcVar11 = sqlite3MPrintf(pParse->db,"EXECUTE %s%s SUBQUERY %d",pcVar11);
    iVar6 = sqlite3VdbeAddOp3(pVVar8,0x96,pParse->iSelectId,0,0);
    sqlite3VdbeChangeP4(pVVar8,iVar6,pcVar11,-1);
  }
  p_Var4 = local_80.xExprCallback;
  uVar1 = pExpr->op;
  if (uVar1 != 'H') {
    pSVar13 = (pExpr->x).pSelect;
    iVar6 = pParse->nMem + 1;
    pParse->nMem = iVar6;
    local_80.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iVar6,(int)local_80.xExprCallback);
    local_80.xExprCallback._0_2_ = (ushort)(byte)p_Var4;
    local_80.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_a4 = uVar5;
    sqlite3VdbeAddOp3(pVVar8,(uint)(uVar1 == 't') * 3 + 7,0,iVar6,0);
    local_80.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)
         CONCAT71(local_80.xExprCallback._1_7_,(uVar1 == 't') * '\x03' + '\x03');
    sqlite3ExprDelete(pParse->db,pSVar13->pLimit);
    pEVar9 = sqlite3PExpr(pParse,0x81,(Expr *)0x0,(Expr *)0x0,sqlite3IntTokens + 1);
    pSVar13->pLimit = pEVar9;
    pSVar13->iLimit = 0;
    iVar12 = sqlite3Select(pParse,pSVar13,(SelectDest *)&local_80);
    iVar6 = (int)pSVar13;
    if (iVar12 != 0) {
      return 0;
    }
    uVar5 = local_a4;
    iVar12 = local_80.xExprCallback._4_4_;
    goto LAB_0019612b;
  }
  pEVar9 = pExpr->pLeft;
  if (rMayHaveNull != 0) {
    sqlite3VdbeAddOp3(pVVar8,10,0,rMayHaveNull,0);
  }
  local_a9 = sqlite3ExprAffinity(pEVar9);
  iVar12 = pParse->nTab;
  pParse->nTab = iVar12 + 1;
  pExpr->iTable = iVar12;
  iVar6 = 0x2a;
  local_8c = sqlite3VdbeAddOp3(pVVar8,0x2a,iVar12,(uint)(local_9c == 0),0);
  if ((rMayHaveNull == 0) && (pVVar8->aOp != (Op *)0x0)) {
    pVVar8->aOp[(long)pVVar8->nOp + -1].p5 = '\b';
  }
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  pCStack_40 = (CollSeq *)0x0;
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\x01';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_48 = &sqlite3CodeSubselect::sortOrder;
  if ((pExpr->flags & 0x800) == 0) {
    pEVar3 = (pExpr->x).pList;
    if (pEVar3 != (ExprList *)0x0) {
      if (local_a9 == '\0') {
        local_a9 = 'b';
      }
      pCStack_40 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
      local_48 = &sqlite3CodeSubselect::sortOrder;
      uVar1 = pParse->nTempReg;
      if (uVar1 == '\0') {
        local_a8 = pParse->nMem + 1;
        pParse->nMem = local_a8;
LAB_00195ed6:
        local_a0 = pParse->nMem + 1;
        pParse->nMem = local_a0;
      }
      else {
        bVar2 = uVar1 - 1;
        pParse->nTempReg = bVar2;
        local_a8 = pParse->aTempReg[bVar2];
        if (bVar2 == 0) goto LAB_00195ed6;
        pParse->nTempReg = uVar1 - 2;
        local_a0 = pParse->aTempReg[(byte)(uVar1 - 2)];
      }
      iVar6 = 10;
      local_a4 = uVar5;
      local_98 = pVVar8;
      sqlite3VdbeAddOp3(pVVar8,10,0,local_a0,0);
      if (0 < pEVar3->nExpr) {
        pEVar14 = pEVar3->a;
        iVar12 = pEVar3->nExpr + 1;
        local_88 = pParse;
        do {
          pEVar9 = pEVar14->pExpr;
          if (-1 < (int)local_a4) {
            local_80.pParse = (Parse *)0x0;
            local_80.walkerDepth = 0;
            local_80.bSelectDepthFirst = '\0';
            local_80._29_3_ = 0;
            local_80.u = (anon_union_8_4_3af73d92_for_u)0x1;
            local_80.xExprCallback = exprNodeIsConstant;
            local_80.xSelectCallback = selectNodeIsConstant;
            sqlite3WalkExpr(&local_80,pEVar9);
            if (local_80.u.i == 0) {
              sqlite3VdbeChangeToNoop(local_98,local_a4);
              local_a4 = 0xffffffff;
            }
          }
          if (local_9c == 0) {
            iVar6 = sqlite3ExprCodeTarget(pParse,pEVar9,local_a8);
            pVVar8 = local_98;
            p2 = local_a0;
            iVar7 = sqlite3VdbeAddOp3(local_98,0x1f,iVar6,1,local_a0);
            sqlite3VdbeChangeP4(pVVar8,iVar7,&local_a9,1);
            sqlite3ExprCacheRemove(local_88,iVar6,1);
            iVar7 = pExpr->iTable;
            iVar6 = 0x61;
            p1 = 0;
            pParse = local_88;
          }
          else {
            iVar6 = sqlite3ExprIsInteger(pEVar9,(int *)&local_80);
            if (iVar6 == 0) {
              p1 = sqlite3ExprCodeTarget(pParse,pEVar9,local_a8);
              pVVar8 = local_98;
              sqlite3VdbeAddOp3(local_98,0x15,p1,local_98->nOp + 2,0);
              iVar7 = pExpr->iTable;
              iVar6 = 0x39;
              p2 = local_a0;
            }
            else {
              iVar7 = pExpr->iTable;
              iVar6 = 0x3a;
              pVVar8 = local_98;
              p2 = local_a0;
              p1 = (int)local_80.xExprCallback;
            }
          }
          sqlite3VdbeAddOp3(pVVar8,iVar6,iVar7,p2,p1);
          pEVar14 = pEVar14 + 1;
          iVar12 = iVar12 + -1;
        } while (1 < iVar12);
      }
      if (local_a8 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar10 = 0;
          do {
            iVar6 = local_a8;
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar10) == local_a8) {
              (&pParse->aColCache[0].tempReg)[lVar10] = '\x01';
              goto LAB_001960d5;
            }
            lVar10 = lVar10 + 0x18;
          } while ((int)lVar10 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = local_a8;
        }
      }
LAB_001960d5:
      pVVar8 = local_98;
      uVar5 = local_a4;
      if (local_a0 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar10 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar10) == local_a0) {
              (&pParse->aColCache[0].tempReg)[lVar10] = '\x01';
              goto LAB_0019610b;
            }
            lVar10 = lVar10 + 0x18;
          } while ((int)lVar10 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = local_a0;
        }
      }
    }
  }
  else {
    local_80.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)CONCAT71(local_80.xExprCallback._1_7_,7);
    local_80.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(pExpr->iTable,(int)local_80.xExprCallback);
    local_80.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_80.xExprCallback._0_2_ = CONCAT11(local_a9,7);
    ((pExpr->x).pSelect)->iLimit = 0;
    pSVar13 = (pExpr->x).pSelect;
    iVar12 = sqlite3Select(pParse,pSVar13,(SelectDest *)&local_80);
    iVar6 = (int)pSVar13;
    if (iVar12 != 0) {
      return 0;
    }
    pEVar3 = ((pExpr->x).pSelect)->pEList;
    if ((pEVar3 != (ExprList *)0x0) && (0 < pEVar3->nExpr)) {
      pEVar9 = pExpr->pLeft;
      pCStack_40 = sqlite3BinaryCompareCollSeq(pParse,pEVar9,pEVar3->a->pExpr);
      iVar6 = (int)pEVar9;
    }
  }
LAB_0019610b:
  if (local_9c == 0) {
    iVar6 = local_8c;
    sqlite3VdbeChangeP4(pVVar8,local_8c,local_58,-6);
  }
  iVar12 = 0;
LAB_0019612b:
  if ((-1 < (int)uVar5) && (uVar5 < (uint)pVVar8->nOp)) {
    pVVar8->aOp[uVar5].p2 = pVVar8->nOp;
  }
  sqlite3ExprCachePop(pParse,iVar6);
  return iVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rMayHaveNull,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int testAddr = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;
  sqlite3ExprCachePush(pParse);

  /* This code must be run in its entirety every time it is encountered
  ** if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasAnyProperty(pExpr, EP_VarSelect) ){
    testAddr = sqlite3CodeOnce(pParse);
  }

#ifndef SQLITE_OMIT_EXPLAIN
  if( pParse->explain==2 ){
    char *zMsg = sqlite3MPrintf(
        pParse->db, "EXECUTE %s%s SUBQUERY %d", testAddr>=0?"":"CORRELATED ",
        pExpr->op==TK_IN?"LIST":"SCALAR", pParse->iNextSelectId
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
#endif

  switch( pExpr->op ){
    case TK_IN: {
      char affinity;              /* Affinity of the LHS of the IN */
      KeyInfo keyInfo;            /* Keyinfo for the generated table */
      static u8 sortOrder = 0;    /* Fake aSortOrder for keyInfo */
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */

      if( rMayHaveNull ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, rMayHaveNull);
      }

      affinity = sqlite3ExprAffinity(pLeft);

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with single-field index keys representing the results
      ** from the SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, !isRowid);
      if( rMayHaveNull==0 ) sqlite3VdbeChangeP5(v, BTREE_UNORDERED);
      memset(&keyInfo, 0, sizeof(keyInfo));
      keyInfo.nField = 1;
      keyInfo.aSortOrder = &sortOrder;

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        SelectDest dest;
        ExprList *pEList;

        assert( !isRowid );
        sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
        dest.affSdst = (u8)affinity;
        assert( (pExpr->iTable&0x0000FFFF)==pExpr->iTable );
        pExpr->x.pSelect->iLimit = 0;
        if( sqlite3Select(pParse, pExpr->x.pSelect, &dest) ){
          return 0;
        }
        pEList = pExpr->x.pSelect->pEList;
        if( ALWAYS(pEList!=0 && pEList->nExpr>0) ){ 
          keyInfo.aColl[0] = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft,
              pEList->a[0].pExpr);
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;

        if( !affinity ){
          affinity = SQLITE_AFF_NONE;
        }
        keyInfo.aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        keyInfo.aSortOrder = &sortOrder;

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, r2);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( testAddr>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, testAddr);
            testAddr = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3ExprCacheAffinityChange(pParse, r3, 1);
              sqlite3VdbeAddOp2(v, OP_IdxInsert, pExpr->iTable, r2);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( !isRowid ){
        sqlite3VdbeChangeP4(v, addr, (void *)&keyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* If this has to be a scalar SELECT.  Generate code to put the
      ** value of this select in a memory cell and record the number
      ** of the memory cell in iColumn.  If this is an EXISTS, write
      ** an integer 0 (not exists) or 1 (exists) into a memory cell
      ** and record that memory cell in iColumn.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECt result */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );

      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      pSel = pExpr->x.pSelect;
      sqlite3SelectDestInit(&dest, 0, ++pParse->nMem);
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        sqlite3VdbeAddOp2(v, OP_Null, 0, dest.iSDParm);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      sqlite3ExprDelete(pParse->db, pSel->pLimit);
      pSel->pLimit = sqlite3PExpr(pParse, TK_INTEGER, 0, 0,
                                  &sqlite3IntTokens[1]);
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetIrreducible(pExpr);
      break;
    }
  }

  if( testAddr>=0 ){
    sqlite3VdbeJumpHere(v, testAddr);
  }
  sqlite3ExprCachePop(pParse, 1);

  return rReg;
}